

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::program(Samba *this,uint32_t dst,uint32_t src)

{
  int iVar1;
  pointer pSVar2;
  SambaError *pSVar3;
  undefined1 local_39;
  char local_38 [7];
  uint8_t Pause;
  uint8_t cmd [20];
  uint32_t src_local;
  uint32_t dst_local;
  Samba *this_local;
  
  local_39 = 0x20;
  if ((this->_debug & 1U) != 0) {
    printf("%s(dst=%#x,src=%#x)\n","program",(ulong)dst,(ulong)src);
  }
  snprintf(local_38,0x14,"y%08X,%08X#",(ulong)dst,(ulong)src);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,&local_39,1);
  if (iVar1 != 1) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_38,0x13);
  if (iVar1 != 0x13) {
    pSVar3 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(pSVar3);
    __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
  }
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[9])(pSVar2,5000);
  local_38[0] = '\0';
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[5])(pSVar2,local_38,3);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  (*pSVar2->_vptr_SerialPort[9])(pSVar2,1000);
  if (local_38[0] == 'Y') {
    return;
  }
  pSVar3 = (SambaError *)__cxa_allocate_exception(8);
  SambaError::SambaError(pSVar3);
  __cxa_throw(pSVar3,&SambaError::typeinfo,SambaError::~SambaError);
}

Assistant:

void
Samba::program(uint32_t dst, uint32_t src)
{
    uint8_t cmd[20];
    uint8_t Pause = ' ';

    if (_debug)
        printf("%s(dst=%#x,src=%#x)\n", __FUNCTION__, dst, src);

    snprintf((char*) cmd, sizeof(cmd), "y%08X,%08X#", dst, src);

    
    if (_port->write(&Pause, 1) != 1)
        throw SambaError();

    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();

  

     _port->timeout(TIMEOUT_LONG);
      cmd[0] = 0;
     _port->read(cmd, 3);
     _port->timeout(TIMEOUT_NORMAL);


     if(cmd[0] == 'Y')
     {
        return;
     }else{
         throw SambaError();
     }
   
}